

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O2

CURLcode Curl_headers_push(Curl_easy *data,char *header,uchar type)

{
  char *pcVar1;
  size_t sVar2;
  Curl_header_store *pCVar3;
  char *pcVar4;
  char *pcVar5;
  uchar *puVar6;
  char cVar7;
  ulong __n;
  ulong __n_00;
  long lVar8;
  Curl_header_store *hs;
  long lVar9;
  
  cVar7 = *header;
  if (cVar7 == '\n') {
    return CURLE_OK;
  }
  if (cVar7 == '\r') {
    return CURLE_OK;
  }
  pcVar1 = strchr(header,0xd);
  if ((pcVar1 == (char *)0x0) && (pcVar1 = strchr(header,10), pcVar1 == (char *)0x0)) {
    return CURLE_WEIRD_SERVER_REPLY;
  }
  __n_00 = (long)pcVar1 - (long)header;
  if ((cVar7 == ' ') || (cVar7 == '\t')) {
    pCVar3 = (data->state).prevhead;
    if (pCVar3 != (Curl_header_store *)0x0) {
      pcVar1 = pCVar3->value;
      sVar2 = strlen(pcVar1);
      lVar9 = (long)pcVar1 - (long)pCVar3;
      do {
        __n = __n_00;
        if (__n == 0) break;
        __n_00 = __n - 1;
      } while ((header[__n - 1] == ' ') || (header[__n - 1] == '\t'));
      lVar8 = sVar2 + __n;
      for (pcVar1 = header + 1;
          ((1 < __n && ((cVar7 == ' ' || (cVar7 == '\t')))) &&
          ((cVar7 = *pcVar1, cVar7 == ' ' || (cVar7 == '\t')))); pcVar1 = pcVar1 + 1) {
        __n = __n - 1;
        lVar8 = lVar8 + -1;
      }
      Curl_node_remove(&pCVar3->node);
      pCVar3 = (Curl_header_store *)Curl_saferealloc(pCVar3,lVar9 + lVar8 + 5);
      if (pCVar3 == (Curl_header_store *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pCVar3->name = pCVar3->buffer;
      pcVar4 = (char *)(lVar9 + (long)pCVar3);
      pCVar3->value = pcVar4;
      memcpy(pcVar4 + sVar2,pcVar1 + -1,__n);
      pCVar3->value[lVar8] = '\0';
      Curl_llist_append(&(data->state).httphdrs,pCVar3,(Curl_llist_node *)pCVar3);
      (data->state).prevhead = pCVar3;
      return CURLE_OK;
    }
    while( true ) {
      if (__n_00 == 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if ((*header != ' ') && (*header != '\t')) break;
      header = header + 1;
      __n_00 = __n_00 - 1;
    }
  }
  pCVar3 = (Curl_header_store *)(*Curl_ccalloc)(1,__n_00 + 0x38);
  if (pCVar3 == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar1 = pCVar3->buffer;
  memcpy(pcVar1,header,__n_00);
  pCVar3->buffer[__n_00] = '\0';
  pcVar4 = pcVar1;
  if (type == '\x10') {
    if (*pcVar1 != ':') goto LAB_0012f5af;
    pcVar4 = &pCVar3->field_0x36;
  }
  while( true ) {
    pcVar5 = pcVar4;
    pcVar4 = pcVar5 + 1;
    if (*pcVar5 == '\0') break;
    if (*pcVar5 == ':') {
      *pcVar5 = '\0';
      for (; (*pcVar4 == '\t' || (*pcVar4 == ' ')); pcVar4 = pcVar4 + 1) {
      }
      for (puVar6 = (uchar *)(pCVar3->buffer + (__n_00 - 1));
          (pcVar4 < puVar6 && ((*puVar6 == ' ' || (*puVar6 == '\t')))); puVar6 = puVar6 + -1) {
        *puVar6 = '\0';
      }
      pCVar3->name = pcVar1;
      pCVar3->value = pcVar4;
      pCVar3->type = type;
      pCVar3->request = (data->state).requests;
      Curl_llist_append(&(data->state).httphdrs,pCVar3,(Curl_llist_node *)pCVar3);
      (data->state).prevhead = pCVar3;
      return CURLE_OK;
    }
  }
LAB_0012f5af:
  (*Curl_cfree)(pCVar3);
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

CURLcode Curl_headers_push(struct Curl_easy *data, const char *header,
                           unsigned char type)
{
  char *value = NULL;
  char *name = NULL;
  char *end;
  size_t hlen; /* length of the incoming header */
  struct Curl_header_store *hs;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  if((header[0] == '\r') || (header[0] == '\n'))
    /* ignore the body separator */
    return CURLE_OK;

  end = strchr(header, '\r');
  if(!end) {
    end = strchr(header, '\n');
    if(!end)
      /* neither CR nor LF as terminator is not a valid header */
      return CURLE_WEIRD_SERVER_REPLY;
  }
  hlen = end - header;

  if((header[0] == ' ') || (header[0] == '\t')) {
    if(data->state.prevhead)
      /* line folding, append value to the previous header's value */
      return unfold_value(data, header, hlen);
    else {
      /* cannot unfold without a previous header. Instead of erroring, just
         pass the leading blanks. */
      while(hlen && ISBLANK(*header)) {
        header++;
        hlen--;
      }
      if(!hlen)
        return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  hs = calloc(1, sizeof(*hs) + hlen);
  if(!hs)
    return CURLE_OUT_OF_MEMORY;
  memcpy(hs->buffer, header, hlen);
  hs->buffer[hlen] = 0; /* nul terminate */

  result = namevalue(hs->buffer, hlen, type, &name, &value);
  if(!result) {
    hs->name = name;
    hs->value = value;
    hs->type = type;
    hs->request = data->state.requests;

    /* insert this node into the list of headers */
    Curl_llist_append(&data->state.httphdrs, hs, &hs->node);
    data->state.prevhead = hs;
  }
  else
    free(hs);
  return result;
}